

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O1

void leveldb_compact_range
               (leveldb_t *db,char *start_key,size_t start_key_len,char *limit_key,
               size_t limit_key_len)

{
  char **ppcVar1;
  char **ppcVar2;
  char *local_20;
  size_t local_18;
  char *local_10;
  size_t local_8;
  
  local_10 = "";
  ppcVar2 = (char **)0x0;
  local_8 = 0;
  local_20 = "";
  local_18 = 0;
  if (start_key != (char *)0x0) {
    ppcVar2 = &local_10;
    local_10 = start_key;
    local_8 = start_key_len;
  }
  if (limit_key == (char *)0x0) {
    ppcVar1 = (char **)0x0;
  }
  else {
    ppcVar1 = &local_20;
    local_20 = limit_key;
    local_18 = limit_key_len;
  }
  (*db->rep->_vptr_DB[0xb])(db->rep,ppcVar2,ppcVar1);
  return;
}

Assistant:

void leveldb_compact_range(leveldb_t* db, const char* start_key,
                           size_t start_key_len, const char* limit_key,
                           size_t limit_key_len) {
  Slice a, b;
  db->rep->CompactRange(
      // Pass null Slice if corresponding "const char*" is null
      (start_key ? (a = Slice(start_key, start_key_len), &a) : nullptr),
      (limit_key ? (b = Slice(limit_key, limit_key_len), &b) : nullptr));
}